

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::update
          (TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *this)

{
  iterator iVar1;
  iterator iVar2;
  TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap> *this_local;
  
  iVar1 = ::std::
          vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>_>
          ::begin(&this->_samples);
  iVar2 = ::std::
          vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>_>
          ::end(&this->_samples);
  ::std::
  sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample*,std::vector<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample>>>,tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::update()const::_lambda(tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample_const&,tinyusdz::TypedTimeSamples<tinyusdz::UsdUVTexture::Wrap>::Sample_const&)_1_>
            (iVar1._M_current,iVar2._M_current);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }